

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

void __thiscall ELFIO::elfio::create(elfio *this,uchar file_class,uchar encoding)

{
  undefined1 local_20 [22];
  uchar encoding_local;
  uchar file_class_local;
  elfio *this_local;
  
  local_20[0xe] = encoding;
  local_20[0xf] = file_class;
  unique0x100000d5 = (basic_ifstream<char,_std::char_traits<char>_> *)this;
  std::
  vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
  ::clear(&this->sections_);
  std::
  vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
  ::clear(&this->segments_);
  endianness_convertor::setup(&this->convertor,local_20[0xe]);
  create_header((elfio *)local_20,(uchar)this,local_20[0xf]);
  std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator=
            (&this->header,
             (unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> *)local_20);
  std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::~unique_ptr
            ((unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> *)local_20);
  create_mandatory_sections(this);
  return;
}

Assistant:

void create( unsigned char file_class, unsigned char encoding )
    {
        sections_.clear();
        segments_.clear();
        convertor.setup( encoding );
        header = create_header( file_class, encoding );
        create_mandatory_sections();
    }